

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O2

SampledSpectrum __thiscall
pbrt::Vertex::Le(Vertex *this,
                vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *infiniteLights,
                Vertex *v,SampledWavelengths *lambda)

{
  anon_union_248_3_83785cfc_for_Vertex_2 *this_00;
  TaggedPointer<pbrt::PointLight,pbrt::DistantLight,pbrt::ProjectionLight,pbrt::GoniometricLight,pbrt::SpotLight,pbrt::DiffuseAreaLight,pbrt::UniformInfiniteLight,pbrt::ImageInfiniteLight,pbrt::PortalImageInfiniteLight>
  *pTVar1;
  array<float,_4> aVar2;
  bool bVar3;
  LightHandle *light;
  TaggedPointer<pbrt::PointLight,pbrt::DistantLight,pbrt::ProjectionLight,pbrt::GoniometricLight,pbrt::SpotLight,pbrt::DiffuseAreaLight,pbrt::UniformInfiniteLight,pbrt::ImageInfiniteLight,pbrt::PortalImageInfiniteLight>
  *this_01;
  undefined1 in_ZMM0 [64];
  undefined1 auVar11 [56];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar14 [60];
  undefined1 auVar12 [64];
  undefined1 auVar15 [56];
  undefined1 auVar13 [64];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  anon_class_16_2_2793a994 func;
  Point3f PVar18;
  Vector3<float> VVar19;
  SampledSpectrum SVar20;
  SampledSpectrum Le;
  Vector3<float> local_a8;
  SampledSpectrum local_98;
  float local_84;
  Ray local_80;
  undefined1 local_58 [16];
  SampledSpectrum local_40;
  
  auVar11 = in_ZMM0._8_56_;
  bVar3 = IsLight(this);
  if (bVar3) {
    PVar18 = Interaction::p(&(v->field_2).ei.super_Interaction);
    local_84 = PVar18.super_Tuple3<pbrt::Point3,_float>.z;
    auVar6._0_8_ = PVar18.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar6._8_56_ = auVar11;
    this_00 = &this->field_2;
    local_58 = auVar6._0_16_;
    PVar18 = Interaction::p(&(this_00->ei).super_Interaction);
    auVar4._0_8_ = PVar18.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar4._8_56_ = auVar11;
    auVar17 = vsubps_avx(local_58,auVar4._0_16_);
    local_a8.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar17);
    local_a8.super_Tuple3<pbrt::Vector3,_float>.z =
         local_84 - PVar18.super_Tuple3<pbrt::Point3,_float>.z;
    auVar14 = (undefined1  [60])0x0;
    auVar16._0_4_ = auVar17._0_4_ * auVar17._0_4_;
    auVar16._4_4_ = auVar17._4_4_ * auVar17._4_4_;
    auVar16._8_4_ = auVar17._8_4_ * auVar17._8_4_;
    auVar16._12_4_ = auVar17._12_4_ * auVar17._12_4_;
    auVar16 = vmovshdup_avx(auVar16);
    auVar16 = vfmadd231ss_fma(auVar16,auVar17,auVar17);
    auVar11 = ZEXT856(0);
    auVar16 = vfmadd231ss_fma(auVar16,ZEXT416((uint)local_a8.super_Tuple3<pbrt::Vector3,_float>.z),
                              ZEXT416((uint)local_a8.super_Tuple3<pbrt::Vector3,_float>.z));
    if ((auVar16._0_4_ != 0.0) || (NAN(auVar16._0_4_))) {
      VVar19 = Normalize<float>(&local_a8);
      auVar12._0_4_ = VVar19.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar12._4_60_ = auVar14;
      auVar5._0_8_ = VVar19.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar5._8_56_ = auVar11;
      local_a8.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar5._0_16_);
      local_a8.super_Tuple3<pbrt::Vector3,_float>.z = auVar12._0_4_;
      bVar3 = IsInfiniteLight(this);
      auVar15 = auVar12._8_56_;
      if (bVar3) {
        auVar6 = ZEXT1664(ZEXT816(0) << 0x40);
        SampledSpectrum::SampledSpectrum(&local_98,0.0);
        this_01 = (TaggedPointer<pbrt::PointLight,pbrt::DistantLight,pbrt::ProjectionLight,pbrt::GoniometricLight,pbrt::SpotLight,pbrt::DiffuseAreaLight,pbrt::UniformInfiniteLight,pbrt::ImageInfiniteLight,pbrt::PortalImageInfiniteLight>
                   *)(infiniteLights->
                     super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>).
                     _M_impl.super__Vector_impl_data._M_start;
        pTVar1 = (TaggedPointer<pbrt::PointLight,pbrt::DistantLight,pbrt::ProjectionLight,pbrt::GoniometricLight,pbrt::SpotLight,pbrt::DiffuseAreaLight,pbrt::UniformInfiniteLight,pbrt::ImageInfiniteLight,pbrt::PortalImageInfiniteLight>
                  *)(infiniteLights->
                    super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>).
                    _M_impl.super__Vector_impl_data._M_finish;
        while( true ) {
          auVar15 = auVar12._8_56_;
          auVar11 = auVar6._8_56_;
          if (this_01 == pTVar1) break;
          PVar18 = Interaction::p(&(this_00->ei).super_Interaction);
          local_80.o.super_Tuple3<pbrt::Point3,_float>.z =
               PVar18.super_Tuple3<pbrt::Point3,_float>.z;
          auVar7._0_8_ = PVar18.super_Tuple3<pbrt::Point3,_float>._0_8_;
          auVar7._8_56_ = auVar11;
          local_80.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar7._0_16_);
          auVar17._0_8_ = local_a8.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
          auVar17._8_4_ = 0x80000000;
          auVar17._12_4_ = 0x80000000;
          local_80.d.super_Tuple3<pbrt::Vector3,_float>.z =
               -local_a8.super_Tuple3<pbrt::Vector3,_float>.z;
          local_80.d.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar17);
          local_80.time = 0.0;
          local_80.medium.
          super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
          .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
                   )0;
          func.lambda = lambda;
          func.ray = &local_80;
          SVar20 = TaggedPointer<pbrt::PointLight,pbrt::DistantLight,pbrt::ProjectionLight,pbrt::GoniometricLight,pbrt::SpotLight,pbrt::DiffuseAreaLight,pbrt::UniformInfiniteLight,pbrt::ImageInfiniteLight,pbrt::PortalImageInfiniteLight>
                   ::
                   Dispatch<pbrt::LightHandle::Le(pbrt::Ray_const&,pbrt::SampledWavelengths_const&)const::_lambda(auto:1)_1_>
                             (this_01,func);
          auVar12._0_8_ = SVar20.values.values._8_8_;
          auVar12._8_56_ = auVar15;
          auVar8._0_8_ = SVar20.values.values._0_8_;
          auVar8._8_56_ = auVar11;
          local_40.values.values = (array<float,_4>)vmovlhps_avx(auVar8._0_16_,auVar12._0_16_);
          auVar6 = ZEXT1664((undefined1  [16])local_40.values.values);
          SampledSpectrum::operator+=(&local_98,&local_40);
          this_01 = this_01 + 8;
        }
        return (array<float,_4>)local_98.values.values;
      }
      if (((this->field_2).si.areaLight.
           super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
           .bits & 0xffffffffffff) != 0) {
        PVar18 = Interaction::p(&(this_00->ei).super_Interaction);
        local_80.o.super_Tuple3<pbrt::Point3,_float>.z = PVar18.super_Tuple3<pbrt::Point3,_float>.z;
        auVar9._0_8_ = PVar18.super_Tuple3<pbrt::Point3,_float>._0_8_;
        auVar9._8_56_ = auVar11;
        local_80.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar9._0_16_);
        SVar20 = LightHandle::L(&(this->field_2).si.areaLight,&local_80.o,
                                &(this->field_2).ei.super_Interaction.n,
                                &(this->field_2).ei.super_Interaction.uv,&local_a8,lambda);
        auVar13._0_8_ = SVar20.values.values._8_8_;
        auVar13._8_56_ = auVar15;
        auVar10._0_8_ = SVar20.values.values._0_8_;
        auVar10._8_56_ = auVar11;
        aVar2.values = (float  [4])vmovlhps_avx(auVar10._0_16_,auVar13._0_16_);
        return (SampledSpectrum)(array<float,_4>)aVar2.values;
      }
    }
  }
  SampledSpectrum::SampledSpectrum(&local_98,0.0);
  return (array<float,_4>)(array<float,_4>)local_98;
}

Assistant:

SampledSpectrum Le(const std::vector<LightHandle> &infiniteLights, const Vertex &v,
                       const SampledWavelengths &lambda) const {
        if (!IsLight())
            return SampledSpectrum(0.f);
        Vector3f w = v.p() - p();
        if (LengthSquared(w) == 0)
            return SampledSpectrum(0.);
        w = Normalize(w);
        if (IsInfiniteLight()) {
            // Return emitted radiance for infinite light sources
            SampledSpectrum Le(0.f);
            for (const auto &light : infiniteLights)
                Le += light.Le(Ray(p(), -w), lambda);
            return Le;

        } else {
            return si.areaLight ? si.areaLight.L(si.p(), si.n, si.uv, w, lambda)
                                : SampledSpectrum(0.);
        }
    }